

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udf_functions_to_test.hpp
# Opt level: O3

void duckdb::udf_unary_function<duckdb::dtime_t>
               (DataChunk *input,ExpressionState *state,Vector *result)

{
  long lVar1;
  long lVar2;
  long lVar3;
  reference pvVar4;
  ulong uVar5;
  ulong uVar6;
  shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> sStack_40;
  undefined8 local_30;
  
  duckdb::DataChunk::Flatten();
  duckdb::Vector::SetVectorType((VectorType)result);
  lVar1 = *(long *)(result + 0x20);
  pvVar4 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)input,0);
  lVar2 = *(long *)(pvVar4 + 0x20);
  pvVar4 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)input,0);
  FlatVector::VerifyFlatVector(pvVar4);
  lVar3 = *(long *)(pvVar4 + 0x28);
  sStack_40.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = *(element_type **)(pvVar4 + 0x30);
  sStack_40.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pvVar4 + 0x38);
  if (sStack_40.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      sStack_40.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           sStack_40.internal.
           super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      sStack_40.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           sStack_40.internal.
           super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_30 = *(undefined8 *)(pvVar4 + 0x40);
  FlatVector::VerifyFlatVector(result);
  *(long *)(result + 0x28) = lVar3;
  shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)(result + 0x30),
             &sStack_40);
  *(undefined8 *)(result + 0x40) = local_30;
  uVar5 = *(ulong *)(input + 0x18);
  if (uVar5 != 0) {
    uVar6 = 0;
    do {
      if ((lVar3 == 0) || ((*(ulong *)(lVar3 + (uVar6 >> 6) * 8) >> (uVar6 & 0x3f) & 1) != 0)) {
        *(undefined8 *)(lVar1 + uVar6 * 8) = *(undefined8 *)(lVar2 + uVar6 * 8);
        uVar5 = *(ulong *)(input + 0x18);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < uVar5);
  }
  if (sStack_40.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               sStack_40.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void udf_unary_function(DataChunk &input, ExpressionState &state, Vector &result) {
	input.Flatten();
	switch (GetTypeId<TYPE>()) {
	case PhysicalType::VARCHAR: {
		result.SetVectorType(VectorType::FLAT_VECTOR);
		auto result_data = FlatVector::GetData<string_t>(result);
		auto ldata = FlatVector::GetData<string_t>(input.data[0]);
		auto &validity = FlatVector::Validity(input.data[0]);

		FlatVector::SetValidity(result, FlatVector::Validity(input.data[0]));

		for (idx_t i = 0; i < input.size(); i++) {
			if (!validity.RowIsValid(i)) {
				continue;
			}
			auto input_length = ldata[i].GetSize();
			string_t target = StringVector::EmptyString(result, input_length);
			auto target_data = target.GetDataWriteable();
			memcpy(target_data, ldata[i].GetData(), input_length);
			target.Finalize();
			result_data[i] = target;
		}
		break;
	}
	default: {
		result.SetVectorType(VectorType::FLAT_VECTOR);
		auto result_data = FlatVector::GetData<TYPE>(result);
		auto ldata = FlatVector::GetData<TYPE>(input.data[0]);
		auto mask = FlatVector::Validity(input.data[0]);
		FlatVector::SetValidity(result, mask);

		for (idx_t i = 0; i < input.size(); i++) {
			if (!mask.RowIsValid(i)) {
				continue;
			}
			result_data[i] = ldata[i];
		}
	}
	}
}